

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
::sparse_hashtable(sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                   *this,MoveDontCopyT mover,
                  sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                  *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_type *in_RDX;
  sh_hashtable_settings<HashObject<8,_8>_*,_HashFn,_unsigned_long,_4> *in_RDI;
  size_type in_stack_00000068;
  sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
  *in_stack_00000070;
  MoveDontCopyT in_stack_0000007c;
  sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
  *in_stack_00000080;
  sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
  *in_stack_ffffffffffffff98;
  libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_> local_21 [33];
  
  sVar1 = *in_RDX;
  sVar2 = in_RDX[1];
  sVar3 = in_RDX[2];
  sVar4 = in_RDX[3];
  in_RDI->enlarge_factor_ = (float)(int)sVar3;
  in_RDI->shrink_factor_ = (float)(int)(sVar3 >> 0x20);
  in_RDI->consider_shrink_ = (bool)(char)sVar4;
  in_RDI->use_empty_ = (bool)(char)(sVar4 >> 8);
  in_RDI->use_deleted_ = (bool)(char)(sVar4 >> 0x10);
  in_RDI->field_0x1b = (char)(sVar4 >> 0x18);
  in_RDI->num_ht_copies_ = (int)(sVar4 >> 0x20);
  in_RDI->enlarge_threshold_ = sVar1;
  in_RDI->shrink_threshold_ = sVar2;
  in_RDI[1].enlarge_threshold_ = in_RDX[4];
  in_RDI[1].shrink_threshold_ = 0;
  get_allocator(in_stack_ffffffffffffff98);
  sparsetable<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
  ::sparsetable((sparsetable<std::pair<HashObject<8,_8>_*const,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                 *)&in_RDI[1].enlarge_factor_,0,local_21);
  libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>::
  ~libc_allocator_with_realloc(local_21);
  bucket_count((sparse_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                *)0x2050e7);
  sparsehash_internal::sh_hashtable_settings<HashObject<8,_8>_*,_HashFn,_unsigned_long,_4>::
  reset_thresholds(in_RDI,(size_type)in_stack_ffffffffffffff98);
  move_from(in_stack_00000080,in_stack_0000007c,in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

sparse_hashtable(MoveDontCopyT mover, sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    move_from(mover, ht, min_buckets_wanted);  // ignores deleted entries
  }